

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          CappedArray<char,_14UL> *params_2)

{
  void *__src;
  char *pcVar1;
  size_t sVar2;
  unsigned_long num;
  long lVar3;
  void *pvVar4;
  char *__dest;
  
  lVar3 = 0;
  if (*(long *)(this + 8) != 0) {
    lVar3 = *(long *)(this + 8) + -1;
  }
  heapString(__return_storage_ptr__,
             (size_t)((params_1->content).ptr + lVar3 + (params->content).size_ + -1));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __src = *(void **)this;
  pvVar4 = (void *)((long)__src + *(long *)(this + 8) + -1);
  if (*(long *)(this + 8) == 0) {
    pvVar4 = (void *)0x0;
    __src = (void *)0x0;
  }
  if (__src != pvVar4) {
    memcpy(__dest,__src,(long)pvVar4 - (long)__src);
    __dest = __dest + ((long)pvVar4 - (long)__src);
  }
  pcVar1 = (params->content).ptr;
  sVar2 = (params->content).size_;
  if (pcVar1 != pcVar1 + (sVar2 - 1)) {
    memcpy(__dest,pcVar1,sVar2 - 1);
    __dest = __dest + (sVar2 - 1);
  }
  pcVar1 = (params_1->content).ptr;
  if (pcVar1 != (char *)0x0) {
    memcpy(__dest,&(params_1->content).size_,(size_t)pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}